

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O0

void __thiscall
DIS::DeadReckoningParameter::marshal(DeadReckoningParameter *this,DataStream *dataStream)

{
  ulong local_20;
  size_t idx;
  DataStream *dataStream_local;
  DeadReckoningParameter *this_local;
  
  DataStream::operator<<(dataStream,this->_deadReckoningAlgorithm);
  for (local_20 = 0; local_20 < 0xf; local_20 = local_20 + 1) {
    DataStream::operator<<(dataStream,this->_otherParameters[local_20]);
  }
  Vector3Float::marshal(&this->_entityLinearAcceleration,dataStream);
  Vector3Float::marshal(&this->_entityAngularVelocity,dataStream);
  return;
}

Assistant:

void DeadReckoningParameter::marshal(DataStream& dataStream) const
{
    dataStream << _deadReckoningAlgorithm;

     for(size_t idx = 0; idx < 15; idx++)
     {
        dataStream << _otherParameters[idx];
     }

    _entityLinearAcceleration.marshal(dataStream);
    _entityAngularVelocity.marshal(dataStream);
}